

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void virtual_do_end(dill_stream s,int package)

{
  ssize_t *psVar1;
  double dVar2;
  char cVar3;
  short sVar4;
  special_operations sVar5;
  short *psVar6;
  char *pcVar7;
  vreg_info *pvVar8;
  special_op p_Var9;
  arg_info_list paVar10;
  private_ctx pdVar11;
  arith_op2 p_Var12;
  bool bVar13;
  vreg_info *pvVar14;
  dill_stream pdVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  char *pcVar23;
  basic_block_conflict pbVar24;
  bit_vec pbVar25;
  long lVar26;
  basic_block_conflict pbVar27;
  long lVar28;
  void *pvVar29;
  int *piVar30;
  short *__ptr;
  undefined2 *puVar31;
  short *psVar32;
  private_ctx pdVar33;
  jmp_data *pjVar34;
  jmp_table pjVar35;
  int *piVar36;
  dill_exec_handle handle;
  int i;
  long lVar37;
  size_t sVar38;
  ulong uVar39;
  byte bVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  virtual_insn *extraout_RDX;
  virtual_insn *extraout_RDX_00;
  virtual_insn *extraout_RDX_01;
  virtual_insn *extraout_RDX_02;
  virtual_insn *extraout_RDX_03;
  virtual_insn *extraout_RDX_04;
  virtual_insn *extraout_RDX_05;
  virtual_insn *extraout_RDX_06;
  virtual_insn *extraout_RDX_07;
  virtual_insn *extraout_RDX_08;
  virtual_insn *extraout_RDX_09;
  virtual_insn *extraout_RDX_10;
  virtual_insn *extraout_RDX_11;
  virtual_insn *extraout_RDX_12;
  virtual_insn *extraout_RDX_13;
  virtual_insn *extraout_RDX_14;
  virtual_insn *extraout_RDX_15;
  virtual_insn *extraout_RDX_16;
  virtual_insn *extraout_RDX_17;
  virtual_insn *extraout_RDX_18;
  virtual_insn *extraout_RDX_19;
  virtual_insn *extraout_RDX_20;
  virtual_insn *extraout_RDX_21;
  virtual_insn *extraout_RDX_22;
  virtual_insn *extraout_RDX_23;
  virtual_insn *extraout_RDX_24;
  virtual_insn *extraout_RDX_25;
  virtual_insn *extraout_RDX_26;
  virtual_insn *extraout_RDX_27;
  virtual_insn *extraout_RDX_28;
  virtual_insn *pvVar44;
  virtual_insn *extraout_RDX_29;
  int *piVar45;
  virtual_insn *extraout_RDX_30;
  virtual_insn *pvVar46;
  virtual_insn *extraout_RDX_31;
  virtual_insn *extraout_RDX_32;
  virtual_insn *extraout_RDX_33;
  virtual_insn *extraout_RDX_34;
  virtual_insn *extraout_RDX_35;
  virtual_insn *extraout_RDX_36;
  virtual_insn *pvVar47;
  uint vreg;
  uint *puVar48;
  uint uVar49;
  code *info_ptr;
  unsigned_long uVar50;
  long lVar51;
  int *piVar52;
  byte bVar53;
  long lVar54;
  basic_block *bb;
  byte bVar55;
  arith_op3 *pp_Var56;
  uint uVar57;
  uint vreg_00;
  virtual_mach_info pmVar58;
  ulong uVar59;
  size_t __n;
  uint uVar60;
  virtual_insn *insn;
  int dtmpa;
  int itmpa;
  int itmpb;
  int local_ec [3];
  virtual_mach_info local_e0;
  ulong local_d8;
  virtual_insn *local_d0;
  long local_c8;
  uint local_bc;
  int *local_b8;
  reg_state local_b0;
  int *local_78;
  ulong local_70;
  uint local_68 [4];
  ulong local_58;
  int *local_50;
  int local_44;
  uint local_40;
  dill_reg local_3c;
  ulong local_38;
  
  pdVar33 = s->p;
  pmVar58 = (virtual_mach_info)pdVar33->mach_info;
  pvVar44 = (virtual_insn *)pdVar33->code_base;
  pvVar47 = (virtual_insn *)pdVar33->cur_ip;
  iVar16 = pmVar58->prefix_code_start;
  iVar22 = s->dill_local_pointer;
  local_44 = package;
  if (virtual_do_end::dill_verbose == -1) {
    pcVar23 = getenv("DILL_VERBOSE");
    virtual_do_end::dill_verbose = (int)(pcVar23 != (char *)0x0);
    pcVar23 = getenv("DILL_NOOPTIMIZE");
    virtual_do_end::no_optimize = (int)(pcVar23 != (char *)0x0);
    pcVar23 = getenv("DILL_OLD_REGS");
    virtual_do_end::old_reg_alloc = (int)(pcVar23 != (char *)0x0);
    pcVar23 = getenv("DILL_DO_EMULATION");
    virtual_do_end::do_emulation = (int)(pcVar23 != (char *)0x0);
  }
  (pdVar33->virtual).code_base = (char *)pvVar44;
  pvVar46 = pvVar44 + iVar16;
  if (iVar16 == -1) {
    pvVar46 = pvVar47;
  }
  pmVar58->bbcount = 0;
  pbVar24 = (basic_block_conflict)dill_malloc(0x68);
  pmVar58->bblist = pbVar24;
  pbVar24->start = 0;
  pbVar24->label = -1;
  iVar16 = s->p->vreg_count + 7 >> 3;
  local_e0 = pmVar58;
  local_d0 = pvVar44;
  pbVar25 = (bit_vec)dill_malloc((long)iVar16 + 2);
  pbVar25->len = (short)iVar16;
  memset(pbVar25->vec,0,(long)iVar16);
  pbVar24->regs_used = pbVar25;
  iVar16 = s->p->vreg_count + 7 >> 3;
  pbVar25 = (bit_vec)dill_malloc((long)iVar16 + 2);
  pbVar25->len = (short)iVar16;
  memset(pbVar25->vec,0,(long)iVar16);
  pvVar44 = local_d0;
  pbVar24->regs_defined = pbVar25;
  pbVar24->reg_assigns = (short *)0x0;
  pbVar24->end_branch_label = -1;
  pbVar24->fall_through = 0;
  pbVar24->is_loop_start = 0;
  pbVar24->is_loop_end = 0;
  if (pvVar46 < pvVar47) {
    uVar59 = (ulong)((long)pvVar46 - (long)local_d0) / 0x28;
    pbVar24->start = uVar59;
    pmVar58 = local_e0;
    for (insn = local_d0 + uVar59; local_e0 = pmVar58, insn < pvVar47; insn = insn + 1) {
      uVar59 = uVar59 + 1;
      build_bb_body(s,insn,(int)uVar59,pvVar44);
      pmVar58 = local_e0;
    }
    pbVar24 = pmVar58->bblist;
    iVar16 = pmVar58->bbcount;
    lVar26 = (long)iVar16;
    pbVar24[lVar26].end_branch_label = -1;
    pbVar24[lVar26].fall_through = 1;
    pbVar24[lVar26].end = uVar59 - 1;
    pmVar58->bbcount = iVar16 + 1;
    pbVar27 = (basic_block_conflict)dill_realloc(pbVar24,lVar26 * 0x68 + 0xd0);
    pmVar58->bblist = pbVar27;
    iVar16 = pmVar58->bbcount;
    pbVar24 = pbVar27 + iVar16;
    pbVar27[iVar16].start = uVar59;
    psVar1 = &pbVar27[iVar16].end;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
    *(int *)(psVar1 + 1) = -1;
    *(int *)((long)psVar1 + 0xc) = -1;
    pbVar27[iVar16].fall_through = 0;
    pbVar27[iVar16].is_loop_start = 0;
    pbVar27[iVar16].is_loop_end = 0;
    iVar17 = s->p->vreg_count + 7 >> 3;
    pbVar25 = (bit_vec)dill_malloc((long)iVar17 + 2);
    pbVar25->len = (short)iVar17;
    memset(pbVar25->vec,0,(long)iVar17);
    pbVar27[iVar16].regs_used = pbVar25;
    iVar17 = s->p->vreg_count + 7 >> 3;
    pbVar25 = (bit_vec)dill_malloc((long)iVar17 + 2);
    pbVar25->len = (short)iVar17;
    memset(pbVar25->vec,0,(long)iVar17);
    pbVar27[iVar16].regs_defined = pbVar25;
  }
  pvVar44 = local_d0;
  pmVar58 = local_e0;
  pbVar24->start = 0;
  lVar26 = 1;
  pvVar47 = local_d0;
  if (local_d0 < pvVar46) {
    do {
      lVar28 = lVar26;
      build_bb_body(s,pvVar47,(int)lVar28,pvVar44);
      lVar26 = lVar28 + 1;
      pvVar47 = pvVar47 + 1;
    } while (pvVar47 < pvVar46);
  }
  else {
    lVar28 = 0;
  }
  pbVar24 = pmVar58->bblist;
  iVar16 = pmVar58->bbcount;
  lVar37 = (long)iVar16;
  pbVar24[lVar37].end_branch_label = -1;
  pbVar24[lVar37].fall_through = 0;
  pbVar24[lVar37].end = lVar28;
  pmVar58->bbcount = iVar16 + 1;
  pbVar24 = (basic_block_conflict)dill_realloc(pbVar24,lVar37 * 0x68 + 0xd0);
  pmVar58->bblist = pbVar24;
  lVar28 = (long)pmVar58->bbcount;
  pbVar24[lVar28].start = lVar26;
  psVar1 = &pbVar24[lVar28].end;
  *(undefined4 *)psVar1 = 0xffffffff;
  *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
  *(int *)(psVar1 + 1) = -1;
  *(int *)((long)psVar1 + 0xc) = -1;
  pbVar24[lVar28].fall_through = 0;
  pbVar24[lVar28].is_loop_start = 0;
  pbVar24[lVar28].is_loop_end = 0;
  iVar16 = s->p->vreg_count + 7 >> 3;
  pbVar25 = (bit_vec)dill_malloc((long)iVar16 + 2);
  pbVar25->len = (short)iVar16;
  memset(pbVar25->vec,0,(long)iVar16);
  pbVar24[lVar28].regs_used = pbVar25;
  iVar16 = s->p->vreg_count + 7 >> 3;
  pbVar25 = (bit_vec)dill_malloc((long)iVar16 + 2);
  pbVar25->len = (short)iVar16;
  memset(pbVar25->vec,0,(long)iVar16);
  pbVar24[lVar28].regs_defined = pbVar25;
  free(pbVar24[lVar28].regs_used);
  free(pbVar24[lVar28].regs_defined);
  pmVar58 = local_e0;
  pbVar24[lVar28 + -1].end = pbVar24[lVar28 + -1].end + -1;
  if (local_e0->bbcount != 0) {
    lVar26 = 0x1c;
    uVar59 = 0;
    do {
      pbVar24 = pmVar58->bblist;
      *(undefined4 *)((long)&pbVar24->end + lVar26 + 4) = 0;
      *(undefined4 *)((long)&pbVar24->start + lVar26) = 0;
      pvVar29 = dill_malloc(8);
      *(void **)((long)&pbVar24->end_branch_label + lVar26) = pvVar29;
      pvVar29 = dill_malloc(4);
      *(void **)((long)&pbVar24->start + lVar26 + 4) = pvVar29;
      *(undefined8 *)((long)&pbVar24->succ_list + lVar26 + 4) = 0;
      uVar59 = uVar59 + 1;
      lVar26 = lVar26 + 0x68;
    } while (uVar59 < (ulong)(long)pmVar58->bbcount);
  }
  if (pmVar58->bbcount != 0) {
    uVar59 = 0;
    do {
      pbVar24 = pmVar58->bblist;
      iVar16 = (int)uVar59;
      if (pbVar24[uVar59].fall_through != 0) {
        pbVar24[uVar59].succ_list[pbVar24[uVar59].succ_count] = iVar16 + 1;
        pbVar24[uVar59].succ_count = pbVar24[uVar59].succ_count + 1;
        piVar30 = (int *)dill_realloc(pbVar24[uVar59 + 1].pred_list,
                                      (long)pbVar24[uVar59 + 1].pred_count * 4 + 4);
        pbVar24[uVar59 + 1].pred_list = piVar30;
        piVar30[pbVar24[uVar59 + 1].pred_count] = iVar16;
        pbVar24[uVar59 + 1].pred_count = pbVar24[uVar59 + 1].pred_count + 1;
      }
      if ((pbVar24[uVar59].end_branch_label != -1) && (0 < pmVar58->bbcount)) {
        iVar17 = 0;
        do {
          pbVar27 = pmVar58->bblist;
          if (pbVar27[iVar17].label == pbVar24[uVar59].end_branch_label) {
            pbVar24[uVar59].succ_list[pbVar24[uVar59].succ_count] = iVar17;
            pbVar24[uVar59].succ_count = pbVar24[uVar59].succ_count + 1;
            piVar30 = (int *)dill_realloc(pbVar27[iVar17].pred_list,
                                          (long)pbVar27[iVar17].pred_count * 4 + 4);
            pbVar27[iVar17].pred_list = piVar30;
            piVar30[pbVar27[iVar17].pred_count] = iVar16;
            pbVar27[iVar17].pred_count = pbVar27[iVar17].pred_count + 1;
            iVar17 = pmVar58->bbcount;
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 < pmVar58->bbcount);
      }
      uVar59 = uVar59 + 1;
    } while (uVar59 < (ulong)(long)pmVar58->bbcount);
  }
  pvVar29 = s->p->mach_info;
  iVar16 = s->p->vreg_count + 7 >> 3;
  __ptr = (short *)dill_malloc((long)iVar16 + 2);
  *__ptr = (short)iVar16;
  psVar32 = __ptr + 1;
  memset(psVar32,0,(long)iVar16);
  if (0 < *(int *)((long)pvVar29 + 8)) {
    lVar26 = 0x48;
    lVar28 = 0;
    do {
      local_d8 = *(ulong *)((long)pvVar29 + 0x10);
      iVar16 = s->p->vreg_count + 7 >> 3;
      puVar31 = (undefined2 *)dill_malloc((long)iVar16 + 2);
      *puVar31 = (short)iVar16;
      memset(puVar31 + 1,0,(long)iVar16);
      *(undefined2 **)(local_d8 + lVar26) = puVar31;
      lVar28 = lVar28 + 1;
      lVar26 = lVar26 + 0x68;
    } while (lVar28 < *(int *)((long)pvVar29 + 8));
  }
  if (0 < *(int *)((long)pvVar29 + 8)) {
    lVar26 = 0;
    do {
      if (0 < *(int *)(*(long *)((long)pvVar29 + 0x10) + 0x1c + lVar26 * 0x68)) {
        lVar28 = *(long *)((long)pvVar29 + 0x10) + lVar26 * 0x68;
        lVar37 = 0;
        do {
          psVar6 = *(short **)
                    (*(long *)((long)pvVar29 + 0x10) + 0x48 +
                    (long)*(int *)(*(long *)(lVar28 + 0x20) + lVar37 * 4) * 0x68);
          sVar4 = *psVar6;
          if (0 < (long)sVar4) {
            lVar51 = *(long *)(lVar28 + 0x38);
            lVar54 = 0;
            do {
              bVar40 = *(byte *)((long)psVar6 + lVar54 + 2);
              bVar55 = *(byte *)(lVar51 + 2 + lVar54) | bVar40;
              if (bVar55 != bVar40) {
                *(byte *)((long)psVar6 + lVar54 + 2) = bVar55;
              }
              lVar54 = lVar54 + 1;
            } while (sVar4 != lVar54);
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)(lVar28 + 0x1c));
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < *(int *)((long)pvVar29 + 8));
  }
  do {
    if (*(int *)((long)pvVar29 + 8) < 1) break;
    lVar26 = 0;
    bVar13 = false;
    do {
      lVar28 = lVar26 * 0x68 + *(long *)((long)pvVar29 + 0x10);
      __n = (size_t)*__ptr;
      memset(psVar32,0,__n);
      if (0 < (long)__n) {
        lVar37 = *(long *)(lVar28 + 0x48);
        sVar38 = 0;
        do {
          bVar40 = *(byte *)(lVar37 + 2 + sVar38) | *(byte *)((long)psVar32 + sVar38);
          if (bVar40 != *(byte *)((long)psVar32 + sVar38)) {
            *(byte *)((long)psVar32 + sVar38) = bVar40;
          }
          sVar38 = sVar38 + 1;
        } while (__n != sVar38);
        lVar37 = *(long *)(lVar28 + 0x40);
        sVar38 = 0;
        do {
          *(byte *)((long)psVar32 + sVar38) =
               *(byte *)((long)psVar32 + sVar38) & ~*(byte *)(lVar37 + 2 + sVar38);
          sVar38 = sVar38 + 1;
        } while (__n != sVar38);
      }
      if (0 < *(int *)(lVar28 + 0x1c)) {
        lVar37 = 0;
        do {
          psVar6 = *(short **)
                    (*(long *)((long)pvVar29 + 0x10) + 0x48 +
                    (long)*(int *)(*(long *)(lVar28 + 0x20) + lVar37 * 4) * 0x68);
          sVar4 = *psVar6;
          bVar40 = 0;
          if (0 < (long)sVar4) {
            lVar51 = 0;
            bVar40 = 0;
            do {
              bVar55 = *(byte *)((long)psVar6 + lVar51 + 2);
              bVar53 = *(byte *)((long)psVar32 + lVar51) | bVar55;
              if (bVar53 != bVar55) {
                *(byte *)((long)psVar6 + lVar51 + 2) = bVar53;
                bVar40 = 1;
              }
              lVar51 = lVar51 + 1;
            } while (sVar4 != lVar51);
          }
          bVar13 = (bool)(bVar13 | bVar40);
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)(lVar28 + 0x1c));
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < *(int *)((long)pvVar29 + 8));
  } while (bVar13);
  pmVar58 = local_e0;
  free(__ptr);
  if (virtual_do_end::no_optimize == 0) {
    if (count_verbose == -1) {
      pcVar23 = getenv("DILL_COUNTS");
      count_verbose = (int)(pcVar23 != (char *)0x0);
    }
    if (count_verbose == 1) {
      pcVar23 = s->p->code_base;
      pcVar7 = s->p->cur_ip;
      uVar59 = 0;
      if (pcVar23 < pcVar7) {
        uVar59 = 0;
        do {
          uVar59 = (ulong)((int)uVar59 + (uint)(*pcVar23 != '\x18'));
          pcVar23 = pcVar23 + 0x28;
        } while (pcVar23 < pcVar7);
      }
      printf("Prior to optimization, %d non-null virtual insns\n",uVar59);
    }
    apply_to_each(s,local_d0,pmVar58,do_const_prop);
    if (count_verbose == 1) {
      pcVar23 = s->p->code_base;
      pcVar7 = s->p->cur_ip;
      uVar59 = 0;
      if (pcVar23 < pcVar7) {
        uVar59 = 0;
        do {
          uVar59 = (ulong)((int)uVar59 + (uint)(*pcVar23 != '\x18'));
          pcVar23 = pcVar23 + 0x28;
        } while (pcVar23 < pcVar7);
      }
      printf("After constant propagation, %d non-null virtual insns\n",uVar59);
    }
    apply_to_each(s,local_d0,pmVar58,do_com_sub_exp);
    if (count_verbose == 1) {
      for (pcVar23 = s->p->code_base; pcVar23 < s->p->cur_ip; pcVar23 = pcVar23 + 0x28) {
      }
      printf("After duplicate instruction elimination (CSE-lite), %d non-null virtual insns\n");
    }
    pvVar44 = local_d0;
    pdVar33 = s->p;
    iVar16 = pdVar33->vreg_count;
    if (0 < (long)iVar16) {
      pvVar8 = pdVar33->vregs;
      lVar26 = 0;
      do {
        *(undefined4 *)((long)&(pvVar8->use_info).use_count + lVar26) = 0;
        lVar26 = lVar26 + 0x2c;
      } while ((long)iVar16 * 0x2c - lVar26 != 0);
    }
    iVar16 = pdVar33->c_param_count;
    if (0 < (long)iVar16) {
      paVar10 = pdVar33->c_param_args;
      lVar26 = 0;
      do {
        *(undefined4 *)((long)&paVar10->used + lVar26) = 0;
        lVar26 = lVar26 + 0x14;
      } while ((long)iVar16 * 0x14 != lVar26);
    }
    apply_to_each(s,local_d0,pmVar58,do_use_def_count);
    apply_to_each(s,pvVar44,pmVar58,kill_dead);
    pdVar33 = s->p;
    if (0 < pdVar33->c_param_count) {
      uVar41 = pdVar33->c_param_count;
      do {
        if (pdVar33->c_param_args[(ulong)uVar41 - 1].used != 0) break;
        pdVar33->c_param_count = uVar41 - 1;
        bVar13 = 1 < (int)uVar41;
        uVar41 = uVar41 - 1;
      } while (bVar13);
    }
  }
  if (virtual_do_end::dill_verbose != 0) {
    pvVar29 = s->p->mach_info;
    if (0 < *(int *)((long)pvVar29 + 8)) {
      lVar28 = 0;
      lVar26 = 0;
      do {
        dump_bb(s,(basic_block *)(*(long *)((long)pvVar29 + 0x10) + lVar28),(int)lVar26);
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x68;
      } while (lVar26 < *(int *)((long)pvVar29 + 8));
    }
    s->dill_debug = 1;
  }
  pdVar33 = s->p;
  (pdVar33->virtual).mach_jump = s->j;
  (pdVar33->virtual).mach_reset = pdVar33->mach_reset;
  (pdVar33->virtual).mach_info = pdVar33->mach_info;
  pvVar44 = (virtual_insn *)pdVar33->code_base;
  pvVar47 = (virtual_insn *)pdVar33->cur_ip;
  (pdVar33->virtual).code_base = (char *)pvVar44;
  (pdVar33->virtual).cur_ip = (char *)pvVar47;
  (pdVar33->virtual).code_limit = pdVar33->code_limit;
  if (virtual_do_end::do_emulation == 0) {
    if (dill_foreign_cg != (dill_foreign_cg_func)0x0) {
      (*dill_foreign_cg)(s,pvVar44,pvVar47);
      goto LAB_0010db96;
    }
    s->j = (pdVar33->native).mach_jump;
    pvVar29 = (pdVar33->native).mach_info;
    pdVar33->mach_reset = (pdVar33->native).mach_reset;
    pdVar33->mach_info = pvVar29;
    pcVar23 = (pdVar33->native).code_base;
    pdVar33->code_base = pcVar23;
    (pdVar33->native).mach_info = (void *)0x0;
    (pdVar33->native).code_base = (char *)0x0;
    if (pcVar23 == (char *)0x0) {
      init_code_block(s);
      pdVar33 = s->p;
      pcVar23 = pdVar33->code_limit;
      (pdVar33->native).code_base = pdVar33->code_base;
      (pdVar33->native).code_limit = pcVar23;
    }
    pdVar33 = s->p;
    pcVar23 = (pdVar33->native).code_limit;
    pdVar33->cur_ip = pdVar33->code_base;
    pdVar33->code_limit = pcVar23;
    (*pdVar33->native_mach_reset)(s);
    iVar16 = (s->p->branch_table).next_label;
    uVar59 = (ulong)iVar16;
    piVar30 = (int *)dill_malloc(uVar59 * 0xc + 0xc);
    if (0 < (long)uVar59) {
      piVar45 = (s->p->branch_table).label_locs;
      piVar36 = piVar30 + 1;
      uVar42 = 0;
      do {
        *piVar36 = (int)uVar42;
        piVar36[-1] = piVar45[uVar42];
        uVar42 = uVar42 + 1;
        piVar36 = piVar36 + 3;
      } while (uVar59 != uVar42);
      if (0 < iVar16) {
        uVar39 = 1;
        uVar42 = 0;
        piVar36 = piVar30;
        do {
          piVar36 = piVar36 + 3;
          uVar43 = uVar42 + 1;
          if (uVar43 < uVar59) {
            piVar45 = piVar30 + uVar42 * 3;
            piVar52 = piVar36;
            uVar42 = uVar59;
            do {
              if (*piVar52 < *piVar45) {
                iVar16 = piVar45[2];
                local_b0.bb = (basic_block_conflict)CONCAT44(local_b0.bb._4_4_,iVar16);
                local_b0.c = *(dill_stream *)piVar45;
                piVar45[2] = piVar52[2];
                *(undefined8 *)piVar45 = *(undefined8 *)piVar52;
                piVar52[2] = iVar16;
                *(dill_stream *)piVar52 = local_b0.c;
              }
              uVar42 = uVar42 - 1;
              piVar52 = piVar52 + 3;
            } while (uVar39 != uVar42);
          }
          uVar39 = uVar39 + 1;
          uVar42 = uVar43;
        } while (uVar43 != uVar59);
      }
    }
    (piVar30 + uVar59 * 3)[0] = -1;
    (piVar30 + uVar59 * 3)[1] = -1;
    piVar30[uVar59 * 3 + 2] = -1;
    (*s->j->proc_start)(s,"no name",s->p->c_param_count,pmVar58->arg_info,(dill_reg *)0x0);
    if (piVar30[1] != -1) {
      piVar36 = piVar30 + 4;
      do {
        iVar16 = dill_alloc_label(s,(char *)0x0);
        piVar36[-2] = iVar16;
        iVar16 = *piVar36;
        piVar36 = piVar36 + 3;
      } while (iVar16 != -1);
    }
    if (virtual_do_end::old_reg_alloc == 0) {
      if (count_verbose == -1) {
        pcVar23 = getenv("DILL_COUNTS");
        count_verbose = (int)(pcVar23 != (char *)0x0);
      }
      local_b0.fpregs = (preg_info *)dill_malloc(4);
      local_b0.ipregs = (preg_info *)dill_malloc(4);
      local_b0.reg_count = 0;
      local_b0.ret_reg = -1;
      local_b0.ret_vreg = 0xffffffff;
      local_b0.param_info = (vreg_info *)dill_malloc((long)s->p->c_param_count * 0x2c);
      pdVar33 = s->p;
      iVar16 = pdVar33->c_param_count;
      if (0 < (long)iVar16) {
        paVar10 = pdVar33->c_param_args;
        piVar36 = &(local_b0.param_info)->value_in_mem;
        lVar26 = 0;
        do {
          cVar3 = (&paVar10->is_register)[lVar26];
          piVar36[-1] = 0;
          if (cVar3 == '\0') {
            *piVar36 = 1;
            iVar22 = -1;
          }
          else {
            *piVar36 = 0;
            iVar22 = *(int *)((long)&paVar10->in_reg + lVar26);
          }
          piVar36[-4] = iVar22;
          piVar36 = piVar36 + 0xb;
          lVar26 = lVar26 + 0x14;
        } while ((long)iVar16 * 0x14 != lVar26);
      }
      uVar41 = 0;
      local_b0.c = s;
      if (pdVar33->vreg_count == 0) {
        pvVar44 = (virtual_insn *)0x0;
      }
      else {
        lVar26 = 8;
        pvVar44 = (virtual_insn *)0x0;
        do {
          iVar16 = dill_type_of(s,(int)pvVar44 + 100);
          if (iVar16 == 0xc) {
            iVar16 = (*s->j->local)(s,1,*(int *)((long)&s->p->vregs->typ + lVar26));
            *(int *)((long)&s->p->vregs->typ + lVar26) = iVar16;
          }
          pvVar44 = (virtual_insn *)((long)pvVar44 + 1);
          lVar26 = lVar26 + 0x2c;
        } while (pvVar44 < (ulong)(long)s->p->vreg_count);
      }
      if (local_e0->bbcount != 0) {
        local_78 = piVar30 + 4;
        uVar41 = 0;
        uVar59 = 0;
        do {
          pvVar8 = local_b0.param_info;
          pdVar15 = local_b0.c;
          pbVar24 = local_e0->bblist;
          uVar42 = pbVar24[uVar59].start;
          local_70 = pbVar24[uVar59].end;
          pdVar33 = s->p;
          lVar26 = (long)pdVar33->vreg_count;
          if (lVar26 != 0) {
            piVar36 = &pdVar33->vregs->value_in_mem;
            do {
              *(undefined8 *)(piVar36 + -5) = 0xffffffffffffffff;
              *(undefined8 *)(piVar36 + -3) = 0xffffffff;
              *(undefined8 *)(piVar36 + -1) = 0xffffffff00000000;
              piVar36 = piVar36 + 0xb;
              lVar26 = lVar26 + -1;
            } while (lVar26 != 0);
          }
          lVar26 = (long)pdVar33->c_param_count;
          if (lVar26 != 0) {
            piVar36 = &(local_b0.param_info)->value_in_mem;
            do {
              *(undefined8 *)(piVar36 + -5) = 0xffffffffffffffff;
              *(undefined8 *)(piVar36 + -3) = 0xffffffff;
              *(undefined8 *)(piVar36 + -1) = 0xffffffff00000000;
              piVar36 = piVar36 + 0xb;
              lVar26 = lVar26 + -1;
            } while (lVar26 != 0);
          }
          bb = pbVar24 + uVar59;
          uVar39 = uVar42;
          local_58 = uVar59;
          if (uVar42 <= local_70) {
            do {
              pvVar44 = local_d0 + uVar39;
              insn_uses(pvVar44,(int *)local_68);
              local_68[3] = insn_defines(pvVar44);
              lVar26 = 0;
              do {
                uVar18 = local_68[lVar26];
                lVar28 = (long)(int)uVar18;
                if (lVar28 != -1) {
                  if (lVar26 != 3) {
                    pdVar33 = pdVar15->p;
                    if ((int)uVar18 < 100) {
                      if (pdVar33->c_param_args[lVar28].is_register != '\0') goto LAB_0010fd97;
                      pvVar14 = pvVar8 + lVar28;
                    }
                    else {
                      pvVar14 = pdVar33->vregs + lVar28 + -100;
                    }
                    pvVar14->last_use = (int)uVar39;
                  }
LAB_0010fd97:
                  pdVar33 = pdVar15->p;
                  if ((int)uVar18 < 100) {
                    if (pdVar33->c_param_args[lVar28].is_register == '\0') {
                      pvVar14 = pvVar8 + lVar28;
                      goto LAB_0010fdd5;
                    }
                  }
                  else {
                    pvVar14 = pdVar33->vregs + lVar28 + -100;
LAB_0010fdd5:
                    if (pvVar14->value_in_mem == -1) {
                      if ((int)uVar18 < 100) {
                        if (pdVar33->c_param_args[lVar28].is_register != '\0') goto LAB_0010fe16;
                        pvVar14 = pvVar8 + lVar28;
                      }
                      else {
                        pvVar14 = pdVar33->vregs + lVar28 + -100;
                      }
                      pvVar14->value_in_mem = (int)uVar39;
                    }
                  }
LAB_0010fe16:
                  if ((int)uVar18 < 100) {
                    if (pdVar33->c_param_args[lVar28].is_register != '\0') goto LAB_0010fe51;
                    pvVar14 = pvVar8 + lVar28;
                  }
                  else {
                    pvVar14 = pdVar33->vregs + lVar28 + -100;
                  }
                  pvVar14->use_metric = pvVar14->use_metric + 1;
                }
LAB_0010fe51:
                lVar26 = lVar26 + 1;
              } while (lVar26 != 4);
              uVar39 = uVar39 + 1;
            } while (uVar39 <= (ulong)bb->end);
          }
          uVar59 = local_58;
          uVar18 = (int)local_70 - (int)uVar42;
          local_70 = (ulong)uVar18;
          pdVar33 = s->p;
          iVar16 = pdVar33->vreg_count;
          if ((long)iVar16 != 0) {
            pdVar11 = (local_b0.c)->p;
            lVar26 = 0x28;
            lVar28 = 0;
            do {
              uVar49 = (uint)lVar28;
              iVar22 = (int)(lVar28 + 100U);
              if ((int)uVar49 < 0) {
                if (pdVar11->c_param_args[iVar22].is_register == '\0') {
                  pvVar8 = local_b0.param_info + iVar22;
                  goto LAB_0010fed7;
                }
LAB_0010fef3:
                pvVar8 = pdVar33->vregs;
                *(int *)((long)pvVar8 + lVar26 + -8) =
                     (int)(*(int *)((long)pvVar8 + lVar26 + -8) * uVar18) /
                     ((*(int *)((long)pvVar8 + lVar26 + -0xc) -
                      *(int *)((long)&pvVar8->typ + lVar26)) + 1);
                *(uint *)((long)&pvVar8->typ + lVar26) =
                     (uint)(((uint)(int)bb->regs_used->vec[(int)uVar49 >> 3] >> (uVar49 & 7) & 1) !=
                           0);
              }
              else {
                pvVar8 = pdVar11->vregs + ((lVar28 + 100U & 0xffffffff) - 100);
LAB_0010fed7:
                if (pvVar8->last_use != -1) goto LAB_0010fef3;
              }
              lVar28 = lVar28 + 1;
              lVar26 = lVar26 + 0x2c;
            } while (iVar16 != lVar28);
          }
          lVar26 = (long)pdVar33->c_param_count;
          if (lVar26 != 0) {
            piVar45 = &(local_b0.param_info)->value_in_mem;
            piVar36 = &pdVar33->c_param_args->in_reg;
            do {
              cVar3 = *(char *)((long)piVar36 + -3);
              piVar45[-1] = 0;
              if (cVar3 == '\0') {
                *piVar45 = 1;
                iVar16 = -1;
              }
              else {
                *piVar45 = 0;
                iVar16 = *piVar36;
              }
              piVar45[-4] = iVar16;
              piVar45 = piVar45 + 0xb;
              piVar36 = piVar36 + 5;
              lVar26 = lVar26 + -1;
            } while (lVar26 != 0);
          }
          if (0 < (long)local_b0.reg_count) {
            lVar26 = 0;
            do {
              local_b0.ipregs[lVar26].holds = -1;
              local_b0.fpregs[lVar26].holds = -1;
              lVar26 = lVar26 + 1;
            } while (local_b0.reg_count != lVar26);
          }
          if (s->dill_debug != 0) {
            printf("============= Starting basic block %zd ===========\n",local_58);
            dump_bb(s,bb,(int)uVar59);
          }
          local_bc = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
          pvVar44 = (virtual_insn *)bb->start;
          if (pvVar44 <= (virtual_insn *)bb->end) {
            do {
              local_b8 = (int *)(long)local_d0[(long)pvVar44].insn_code;
              iVar16 = (int)pvVar44;
              uVar18 = iVar16 * 0x28;
              pvVar29 = (void *)(ulong)uVar18;
              local_b0.bb = bb;
              if (piVar30[(long)(int)uVar41 * 3] == uVar18) {
                puVar48 = (uint *)(piVar30 + (long)(int)uVar41 * 3 + 3);
                do {
                  dill_mark_label(s,puVar48[-1]);
                  uVar41 = uVar41 + 1;
                  uVar49 = *puVar48;
                  puVar48 = puVar48 + 3;
                } while (uVar49 == uVar18);
              }
              pvVar47 = local_d0 + (long)pvVar44;
              if (s->dill_debug != 0) {
                printf("   v    loc(%d)  ");
                virtual_print_insn(s,pvVar29,pvVar47);
                putchar(10);
              }
              if (pvVar44 == (virtual_insn *)bb->end) {
                spill_current_pregs(&local_b0);
              }
              insn_uses(pvVar47,(int *)local_68);
              iVar22 = insn_defines(pvVar47);
              local_d8 = CONCAT44(local_d8._4_4_,iVar22);
              lVar26 = (long)local_b0.ret_vreg;
              pvVar46 = extraout_RDX_30;
              if (lVar26 != -1) {
                pvVar8 = s->p->vregs;
                pvVar46 = (virtual_insn *)(long)pvVar8[lVar26 + -100].last_use;
                if (pvVar44 == pvVar46) {
                  pvVar8[lVar26 + -100].in_reg = local_b0.ret_reg;
                }
                else {
                  iVar22 = select_reg(&local_b0,local_b0.ret_vreg,iVar16,0);
                  p_Var12 = s->j->mov;
                  iVar17 = dill_type_of(s,local_b0.ret_vreg);
                  (*p_Var12)(s,iVar17,0,iVar22,local_b0.ret_reg);
                  pvVar46 = extraout_RDX_31;
                }
                local_b0.ret_vreg = 0xffffffff;
              }
              lVar26 = 0;
              do {
                if (local_68[lVar26] == 0xffffffff) break;
                iVar22 = select_reg(&local_b0,local_68[lVar26],iVar16,1);
                local_ec[lVar26] = iVar22;
                lVar26 = lVar26 + 1;
                pvVar46 = extraout_RDX_32;
              } while (lVar26 != 3);
              uVar59 = local_d8;
              uVar18 = (uint)local_d8;
              if ((uint)local_d8 == 0xffffffff) {
                iVar16 = -1;
              }
              else {
                iVar16 = select_reg(&local_b0,(uint)local_d8,iVar16,0);
                pvVar46 = extraout_RDX_33;
              }
              if ((s->dill_debug != 0) && ((uVar18 != 0xffffffff || (local_68[0] != 0xffffffff)))) {
                printf("\tvregs\t\t");
                if (uVar18 != 0xffffffff) {
                  uVar42 = 0x50;
                  if (99 < (int)uVar18) {
                    iVar22 = dill_type_of(s,uVar18);
                    uVar42 = (ulong)((uint)(iVar22 != 0xc) << 4 | 0x42);
                  }
                  printf(" %c%d = ",uVar42,uVar59 & 0xffffffff);
                  iVar22 = dill_type_of(s,uVar18);
                  dill_dump_reg(s,iVar22,iVar16);
                  printf("(%d) - ");
                }
                lVar26 = 0;
                do {
                  uVar18 = local_68[lVar26];
                  if (uVar18 == 0xffffffff) break;
                  uVar59 = 0x50;
                  if (99 < (int)uVar18) {
                    iVar22 = dill_type_of(s,uVar18);
                    uVar59 = (ulong)((uint)(iVar22 != 0xc) << 4 | 0x42);
                  }
                  printf(" %c%d = ",uVar59,(ulong)uVar18);
                  iVar22 = dill_type_of(s,uVar18);
                  dill_dump_reg(s,iVar22,local_ec[lVar26]);
                  printf("(%d) - ");
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 3);
                putchar(10);
                pvVar46 = extraout_RDX_34;
                uVar18 = (uint)local_d8;
              }
              switch(pvVar47->class_code) {
              case '\0':
                pp_Var56 = s->j->jmp_a3;
                pjVar34 = s->j->a3_data;
                goto LAB_00110756;
              case '\x01':
                pjVar34 = s->j->a3i_data;
                (*s->j->jmp_a3i[(long)local_b8])
                          (s,(int)pjVar34[(long)local_b8].data1,(int)pjVar34[(long)local_b8].data2,
                           iVar16,local_ec[0],(pvVar47->opnds).spec.param);
                break;
              case '\x02':
                pjVar34 = s->j->a2_data;
                (*s->j->jmp_a2[(long)local_b8])
                          (s,(int)pjVar34[(long)local_b8].data1,(int)pjVar34[(long)local_b8].data2,
                           iVar16,local_ec[0]);
                break;
              case '\x03':
                (*s->j->ret)(s,(int)pvVar47->insn_code,0,local_ec[0]);
                break;
              case '\x04':
                (*s->j->convert)(s,(uint)((byte)pvVar47->insn_code >> 4),
                                 (byte)pvVar47->insn_code & 0xf,iVar16,local_ec[0]);
                break;
              case '\x05':
                bVar40 = pvVar47->insn_code;
                uVar49 = bVar40 & 0xf;
                if ((bVar40 & 0x10) == 0) {
                  if ((bVar40 & 0x20) == 0) {
                    (*s->j->load)(s,uVar49,0,iVar16,local_ec[0],local_ec[1]);
                  }
                  else {
                    (*s->j->bsload)(s,uVar49,0,iVar16,local_ec[0],local_ec[1]);
                  }
                }
                else {
                  (*s->j->store)(s,uVar49,0,local_ec[2],local_ec[0],local_ec[1]);
                }
                break;
              case '\x06':
                bVar40 = pvVar47->insn_code;
                uVar49 = bVar40 & 0xf;
                if ((bVar40 & 0x10) == 0) {
                  lVar26 = (pvVar47->opnds).spec.param;
                  if ((bVar40 & 0x20) == 0) {
                    (*s->j->loadi)(s,uVar49,0,iVar16,local_ec[0],lVar26);
                  }
                  else {
                    (*s->j->bsloadi)(s,uVar49,0,iVar16,local_ec[0],lVar26);
                  }
                }
                else {
                  (*s->j->storei)(s,uVar49,0,local_ec[1],local_ec[0],(pvVar47->opnds).spec.param);
                }
                break;
              case '\a':
                (*s->j->set)(s,(byte)pvVar47->insn_code & 0xf,0,iVar16,(pvVar47->opnds).spec.param);
                break;
              case '\b':
                (*s->j->setf)(s,(byte)pvVar47->insn_code & 0xf,0,iVar16,(pvVar47->opnds).sf.imm);
                break;
              case '\t':
                pjVar35 = s->j;
                uVar49 = (byte)pvVar47->insn_code & 0xf;
                iVar22 = local_ec[0];
LAB_001108ae:
                (*pjVar35->mov)(s,uVar49,0,iVar16,iVar22);
                break;
              case '\n':
                (*s->j->reti)(s,(byte)pvVar47->insn_code & 0xf,0,(pvVar47->opnds).spec.param);
                break;
              case '\v':
                cVar3 = pvVar47->insn_code;
                iVar22 = piVar30[1];
                if (iVar22 != -1) {
                  piVar36 = local_78;
                  do {
                    if (iVar22 == (pvVar47->opnds).a3.src2) {
                      iVar22 = piVar36[-2];
                      goto LAB_001108c0;
                    }
                    iVar22 = *piVar36;
                    piVar36 = piVar36 + 3;
                  } while (iVar22 != -1);
                }
                puts("New label not found");
                iVar22 = -1;
LAB_001108c0:
                pjVar34 = s->j->b_data;
                (*s->j->jmp_b[cVar3])
                          (s,(int)pjVar34[cVar3].data1,(int)pjVar34[cVar3].data2,local_ec[0],
                           local_ec[1],iVar22);
                goto LAB_00110918;
              case '\f':
                cVar3 = pvVar47->insn_code;
                iVar22 = piVar30[1];
                if (iVar22 != -1) {
                  piVar36 = local_78;
                  do {
                    if (iVar22 == (pvVar47->opnds).a3.src1) {
                      iVar22 = piVar36[-2];
                      goto LAB_001108ee;
                    }
                    iVar22 = *piVar36;
                    piVar36 = piVar36 + 3;
                  } while (iVar22 != -1);
                }
                puts("New label not found");
                iVar22 = -1;
LAB_001108ee:
                pjVar34 = s->j->b_data;
                (*s->j->jmp_bi[cVar3])
                          (s,(int)pjVar34[cVar3].data1,(int)pjVar34[cVar3].data2,local_ec[0],
                           (pvVar47->opnds).bri.imm_l,iVar22);
LAB_00110918:
                uVar18 = (uint)local_d8;
                break;
              case '\r':
                iVar22 = piVar30[1];
                if (iVar22 != -1) {
                  piVar36 = local_78;
                  do {
                    if (iVar22 == (pvVar47->opnds).a3.src2) {
                      uVar50 = (unsigned_long)piVar36[-2];
                      goto LAB_00110922;
                    }
                    iVar22 = *piVar36;
                    piVar36 = piVar36 + 3;
                  } while (iVar22 != -1);
                }
                puts("New label not found");
                uVar50 = 0xffffffffffffffff;
LAB_00110922:
                (*s->j->jv)(s,uVar50);
                break;
              case '\x0e':
                p_Var9 = s->j->special;
                if (p_Var9 != (special_op)0x0) {
                  (*p_Var9)(s,(pvVar47->opnds).spec.type,(pvVar47->opnds).spec.param);
                }
                break;
              case '\x0f':
                (*s->j->jp)(s,(long)local_ec[0]);
                break;
              case '\x10':
                (*s->j->jpi)(s,(pvVar47->opnds).bri.imm_a);
                break;
              case '\x11':
                bVar40 = pvVar47->insn_code;
                if ((undefined1  [32])((undefined1  [32])pvVar47->opnds & (undefined1  [32])0x8000)
                    == (undefined1  [32])0x0) {
                  pjVar35 = s->j;
                  iVar22 = local_ec[0];
                }
                else {
                  pushpop_inuse_regs(s,0,pvVar46);
                  pjVar35 = s->j;
                  iVar22 = (int)*(short *)&pvVar47->opnds;
                  uVar18 = (uint)local_d8;
                }
                (*pjVar35->push)(s,bVar40 & 0xf,iVar22);
                break;
              case '\x12':
                if ((pvVar47->insn_code & 0xfU) == 8) {
                  (*s->j->pushpi)(s,8,(pvVar47->opnds).bri.imm_a);
                }
                else {
                  (*s->j->pushi)(s,4,(pvVar47->opnds).spec.param);
                }
                break;
              case '\x13':
                (*s->j->pushfi)(s,(byte)pvVar47->insn_code & 0xf,(pvVar47->opnds).sf.imm);
                break;
              case '\x14':
                uVar18 = (byte)pvVar47->insn_code & 0xf;
                if ((pvVar47->insn_code & 0x10U) == 0) {
                  iVar22 = (*s->j->calli)(s,uVar18,(pvVar47->opnds).bri.imm_a,
                                          (pvVar47->opnds).calli.xfer_name);
                  pvVar47 = extraout_RDX_35;
                }
                else {
                  iVar22 = (*s->j->callr)(s,uVar18,local_ec[0]);
                  pvVar47 = extraout_RDX_36;
                }
                local_b0.ret_reg = iVar22;
                uVar18 = (uint)local_d8;
                local_b0.ret_vreg = (uint)local_d8;
                pushpop_inuse_regs(s,1,pvVar47);
                break;
              case '\x15':
                lVar26 = (long)(int)local_68[0];
                if (lVar26 < 100) {
                  piVar36 = &s->p->c_param_args[lVar26].offset;
                }
                else {
                  piVar36 = &s->p->vregs[lVar26 + -100].offset;
                }
                lVar26 = (long)(pvVar47->opnds).a3.src2 + (long)*piVar36;
                pjVar35 = s->j;
                if ((int)lVar26 == 0) {
                  uVar49 = 8;
                  iVar22 = s->dill_local_pointer;
                  goto LAB_001108ae;
                }
                (*pjVar35->jmp_a3i[0x28])
                          (s,(int)pjVar35->a3i_data[0x28].data1,(int)pjVar35->a3i_data[0x28].data2,
                           iVar16,s->dill_local_pointer,lVar26);
                break;
              case '\x16':
                pp_Var56 = s->j->jmp_c;
                pjVar34 = s->j->c_data;
LAB_00110756:
                (*pp_Var56[(long)local_b8])
                          (s,(int)pjVar34[(long)local_b8].data1,(int)pjVar34[(long)local_b8].data2,
                           iVar16,local_ec[0],local_ec[1]);
              }
              if ((uVar18 != 0xffffffff) && (iVar16 == -1)) {
                if ((int)uVar18 < 100) {
                  piVar36 = &s->p->c_param_args[(int)uVar18].offset;
                }
                else {
                  piVar36 = &s->p->vregs[(ulong)uVar18 - 100].offset;
                }
                iVar16 = *piVar36;
                iVar22 = dill_type_of(s,uVar18);
                pdVar15 = local_b0.c;
                pdVar33 = (local_b0.c)->p;
                if ((int)uVar18 < 100) {
                  if (pdVar33->c_param_args[(int)uVar18].is_register == '\0') {
                    pvVar8 = local_b0.param_info + (int)uVar18;
                    goto LAB_001109eb;
                  }
                }
                else {
                  pvVar8 = pdVar33->vregs + ((ulong)uVar18 - 100);
LAB_001109eb:
                  pvVar8->value_in_mem = 1;
                }
                if ((int)(uint)local_d8 < 100) {
                  if (pdVar33->c_param_args[(int)uVar18].is_register == '\0') {
                    pvVar8 = local_b0.param_info + (int)uVar18;
                    goto LAB_00110a3e;
                  }
                }
                else {
                  pvVar8 = pdVar33->vregs + ((local_d8 & 0xffffffff) - 100);
LAB_00110a3e:
                  pvVar8->update_in_reg = 0;
                }
                if (iVar16 == -0x21524111) {
                  iVar16 = (*s->j->local)(s,0,iVar22);
                  s->p->vregs[(long)(int)uVar18 + -100].offset = iVar16;
                }
                uVar59 = local_d8;
                iVar17 = (uint)local_d8;
                (*s->j->storei)(s,iVar22,0,-1,(&s->dill_local_pointer)[(int)(uint)local_d8 < 100],
                                (long)iVar16);
                if (iVar17 < 100) {
                  if (pdVar15->p->c_param_args[(int)uVar18].is_register == '\0') {
                    pvVar8 = local_b0.param_info + (int)uVar18;
                    goto LAB_00110b0f;
                  }
                }
                else {
                  pvVar8 = pdVar15->p->vregs + ((uVar59 & 0xffffffff) - 100);
LAB_00110b0f:
                  pvVar8->in_reg = -1;
                }
                local_b0.ret_vreg = 0xffffffff;
              }
              pvVar44 = (virtual_insn *)&pvVar44->insn_code;
            } while (pvVar44 <= (undefined1 *)bb->end);
          }
          spill_current_pregs(&local_b0);
          uVar59 = local_58;
          if (count_verbose != 0) {
            uVar18 = (*s->j->count_insn)(s,local_bc,*(int *)&s->p->cur_ip - *(int *)&s->p->code_base
                                        );
            printf("Basic Block %zd, %d virtual instructions, %d physical instructions\n",uVar59,
                   local_70,(ulong)uVar18);
          }
          uVar59 = uVar59 + 1;
        } while (uVar59 < (ulong)(long)local_e0->bbcount);
      }
      if ((long)pvVar44 * 0x28 == (ulong)(uint)piVar30[(long)(int)uVar41 * 3]) {
        dill_mark_label(s,piVar30[(long)(int)uVar41 * 3 + 2]);
        uVar41 = uVar41 + 1;
      }
      uVar18 = piVar30[(long)(int)uVar41 * 3];
      if (uVar18 != 0xffffffff) {
        uVar49 = (int)pvVar44 * 0x28;
        if (uVar18 == uVar49) {
          puVar48 = (uint *)(piVar30 + (long)(int)uVar41 * 3);
          do {
            dill_mark_label(s,puVar48[2]);
            uVar18 = puVar48[3];
            uVar41 = uVar41 + 1;
            puVar48 = puVar48 + 3;
          } while (uVar18 == uVar49);
        }
        if (uVar18 != 0xffffffff) {
          printf("Some labels2 (%d, old loc %d name \"%s\") not placed\n",(ulong)uVar41,
                 (ulong)uVar18,(s->p->branch_table).label_name[(int)uVar18]);
        }
      }
      free(local_b0.fpregs);
      free(local_b0.ipregs);
      free(local_b0.param_info);
    }
    else {
      iVar16 = dill_raw_getreg(s,(dill_reg *)&local_b0,6,1);
      if ((iVar16 == 0) || (iVar16 = dill_raw_getreg(s,(dill_reg *)local_68,6,1), iVar16 == 0)) {
        virtual_do_end_cold_1();
      }
      dill_raw_getreg(s,local_ec,10,1);
      dill_raw_getreg(s,&local_3c,10,1);
      pdVar33 = s->p;
      uVar41 = 0xfffffff7;
      lVar26 = 0;
      do {
        if (uVar41 < 2) {
          *(int *)((long)pdVar33->v_tmps[0] + lVar26) = local_ec[0];
          *(dill_reg *)((long)pdVar33->v_tmps[0] + lVar26 + 4) = local_3c;
          piVar36 = local_ec;
        }
        else {
          *(undefined4 *)((long)pdVar33->v_tmps[0] + lVar26) = local_b0.c._0_4_;
          *(uint *)((long)pdVar33->v_tmps[0] + lVar26 + 4) = local_68[0];
          piVar36 = &pdVar33->machine_strr_tmp_reg;
        }
        *(int *)((long)pdVar33->v_tmps[0] + lVar26 + 8) = *piVar36;
        lVar26 = lVar26 + 0xc;
        uVar41 = uVar41 + 1;
      } while (lVar26 != 0x90);
      if (0 < pmVar58->bbcount) {
        lVar26 = 0;
        do {
          pbVar24 = pmVar58->bblist;
          psVar32 = (short *)dill_malloc((long)s->p->vreg_count * 2);
          pbVar24[lVar26].reg_assigns = psVar32;
          memset(psVar32,0xff,(long)s->p->vreg_count * 2);
          foreach_bit(pbVar24[lVar26].regs_defined,do_reg_assign,pbVar24 + lVar26,s);
          pdVar33 = s->p;
          if (0 < pdVar33->vreg_count) {
            lVar28 = 0;
            lVar37 = 0;
            do {
              iVar16 = (int)pbVar24[lVar26].reg_assigns[lVar37];
              if (iVar16 != -1) {
                dill_raw_putreg(s,iVar16,*(int *)((long)&pdVar33->vregs->typ + lVar28));
              }
              lVar37 = lVar37 + 1;
              pdVar33 = s->p;
              lVar28 = lVar28 + 0x2c;
            } while (lVar37 < pdVar33->vreg_count);
          }
          lVar26 = lVar26 + 1;
          pmVar58 = local_e0;
        } while (lVar26 < local_e0->bbcount);
      }
      pdVar33 = s->p;
      if (0 < pdVar33->vreg_count) {
        lVar26 = 8;
        uVar59 = 0;
        do {
          if (iVar22 - 100 == uVar59) {
            pvVar8 = pdVar33->vregs;
            *(int *)((long)pvVar8 + lVar26 + -4) = s->dill_local_pointer;
            *(undefined4 *)((long)&pvVar8->typ + lVar26) = 0;
          }
          else {
            pvVar8 = pdVar33->vregs;
            iVar16 = *(int *)((long)pvVar8 + lVar26 + -8);
            if (iVar16 == 0xc) {
              iVar16 = *(int *)((long)&pvVar8->typ + lVar26);
              *(undefined4 *)((long)pvVar8 + lVar26 + -4) = 0xffffffff;
              pjVar35 = s->j;
              iVar17 = 1;
            }
            else {
              *(undefined4 *)((long)pvVar8 + lVar26 + -4) = 0xffffffff;
              if (iVar16 == 0xb) {
                puts("internal void register error");
                goto LAB_0010dfc2;
              }
              pjVar35 = s->j;
              iVar17 = 0;
            }
            iVar16 = (*pjVar35->local)(s,iVar17,iVar16);
            *(int *)((long)&s->p->vregs->typ + lVar26) = iVar16;
          }
LAB_0010dfc2:
          uVar59 = uVar59 + 1;
          pdVar33 = s->p;
          lVar26 = lVar26 + 0x2c;
        } while ((long)uVar59 < (long)pdVar33->vreg_count);
      }
      if (count_verbose == -1) {
        pcVar23 = getenv("DILL_COUNTS");
        count_verbose = (int)(pcVar23 != (char *)0x0);
      }
      if (pmVar58->bbcount == 0) {
        uVar59 = 0;
        uVar41 = 0;
      }
      else {
        local_b8 = piVar30 + 3;
        local_50 = piVar30 + 4;
        uVar41 = 0;
        uVar42 = 0;
        do {
          pbVar27 = local_e0->bblist;
          pbVar24 = pbVar27 + uVar42;
          local_78 = (int *)CONCAT44(local_78._4_4_,*(int *)&s->p->cur_ip - *(int *)&s->p->code_base
                                    );
          local_bc = (int)pbVar27[uVar42].end - (int)pbVar27[uVar42].start;
          info_ptr = emit_getreg;
          local_70 = uVar42;
          foreach_bit(pbVar27[uVar42].regs_defined,emit_getreg,pbVar24,s);
          uVar59 = pbVar27[uVar42].start;
          local_58 = uVar42 * 0x68;
          if (uVar59 <= (ulong)pbVar27[uVar42].end) {
            iVar16 = 0;
            uVar18 = 0xffffffff;
            pvVar44 = extraout_RDX;
            do {
              iVar22 = (int)uVar59 * 0x28;
              if ((iVar22 != 0) && (piVar30[(long)(int)uVar41 * 3] == iVar22)) {
                piVar36 = local_b8 + (long)(int)uVar41 * 3;
                do {
                  info_ptr = (code *)(ulong)(uint)piVar36[-1];
                  dill_mark_label(s,piVar36[-1]);
                  uVar41 = uVar41 + 1;
                  iVar17 = *piVar36;
                  pvVar44 = extraout_RDX_00;
                  piVar36 = piVar36 + 3;
                } while (iVar17 == iVar22);
              }
              pvVar47 = local_d0 + uVar59;
              if (s->dill_debug != 0) {
                printf("   v    ");
                virtual_print_insn(s,info_ptr,pvVar47);
                putchar(10);
                pvVar44 = extraout_RDX_01;
              }
              local_d8 = uVar59;
              switch(pvVar47->class_code) {
              case '\0':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                uVar60 = (pvVar47->opnds).a3.src2;
                iVar22 = (int)pvVar47->insn_code;
                if ((uVar18 == uVar60) && (iVar17 = is_commutative(iVar22), iVar17 != 0)) {
                  uVar60 = (pvVar47->opnds).a3.src1;
                  uVar57 = (pvVar47->opnds).a3.src2;
                }
                iVar17 = preg_of(s,pbVar24,uVar49);
                local_c8 = CONCAT44(local_c8._4_4_,iVar17);
                iVar17 = preg_of(s,pbVar24,uVar57);
                iVar20 = preg_of(s,pbVar24,uVar60);
                if (iVar17 == -1) {
                  if (uVar18 == uVar57) {
                    iVar17 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar17][0] != -1) {
                      if (99 < (int)uVar57) {
                        pvVar8 = s->p->vregs;
                        if ((pvVar8[(ulong)uVar57 - 100].use_info.use_count == 1) &&
                           (pvVar8[(ulong)uVar57 - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                          }
                          s->p->cur_ip = s->p->code_base + iVar16;
                        }
                      }
                      iVar17 = dill_type_of(s,uVar57);
                      iVar17 = s->p->v_tmps[iVar17][0];
                      goto LAB_0010f52d;
                    }
                  }
                  iVar17 = load_oprnd(s,0,uVar57);
                }
LAB_0010f52d:
                if (iVar20 == -1) {
                  iVar20 = load_oprnd(s,1,uVar60);
                }
                iVar21 = (uint)local_c8;
                if ((uint)local_c8 == -1) {
                  pdVar33 = s->p;
                  iVar21 = dill_type_of(s,uVar49);
                  iVar21 = pdVar33->v_tmps[iVar21][0];
                }
                pjVar34 = s->j->a3_data;
                (*s->j->jmp_a3[iVar22])
                          (s,(int)pjVar34[iVar22].data1,(int)pjVar34[iVar22].data2,iVar21,iVar17,
                           iVar20);
                goto LAB_0010f8fc;
              case '\x01':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                lVar26 = (pvVar47->opnds).spec.param;
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,uVar57);
                cVar3 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  if (uVar18 == uVar57) {
                    iVar22 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar57) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar57 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar57 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar57);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f5ad;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar57);
                }
LAB_0010f5ad:
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                pjVar34 = s->j->a3i_data;
                (*s->j->jmp_a3i[cVar3])
                          (s,(int)pjVar34[cVar3].data1,(int)pjVar34[cVar3].data2,iVar17,iVar22,
                           lVar26);
                goto LAB_0010f8fc;
              case '\x02':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,uVar57);
                cVar3 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  if (uVar18 == uVar57) {
                    iVar22 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar57) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar57 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar57 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar57);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f47a;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar57);
                }
LAB_0010f47a:
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                pjVar34 = s->j->a2_data;
                (*s->j->jmp_a2[cVar3])
                          (s,(int)pjVar34[cVar3].data1,(int)pjVar34[cVar3].data2,iVar17,iVar22);
                goto LAB_0010f6a4;
              case '\x03':
                uVar49 = (pvVar47->opnds).a3.dest;
                iVar22 = preg_of(s,pbVar24,uVar49);
                if (iVar22 == -1) {
                  if (uVar18 == uVar49) {
                    iVar22 = dill_type_of(s,uVar49);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar49) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar49 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar49 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar49);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f4fa;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar49);
                }
LAB_0010f4fa:
                info_ptr = (code *)(ulong)(uint)(int)pvVar47->insn_code;
                (*s->j->ret)(s,(int)pvVar47->insn_code,0,iVar22);
                pvVar44 = extraout_RDX_16;
                goto LAB_0010f510;
              case '\x04':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,uVar57);
                bVar40 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  if (uVar18 == uVar57) {
                    iVar22 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar57) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar57 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar57 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar57);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f377;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar57);
                }
LAB_0010f377:
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                (*s->j->convert)(s,(uint)(bVar40 >> 4),bVar40 & 0xf,iVar17,iVar22);
                goto LAB_0010f8fc;
              case '\x05':
                iVar22 = (pvVar47->opnds).a3.dest;
                uVar49 = (pvVar47->opnds).a3.src1;
                uVar57 = (pvVar47->opnds).a3.src2;
                local_38 = (ulong)(byte)pvVar47->insn_code;
                uVar60 = uVar49;
                if (uVar18 == uVar57) {
                  uVar60 = uVar57;
                  uVar57 = uVar49;
                }
                local_c8 = CONCAT44(local_c8._4_4_,iVar22);
                iVar17 = preg_of(s,pbVar24,iVar22);
                iVar22 = preg_of(s,pbVar24,uVar60);
                local_40 = uVar57;
                iVar20 = preg_of(s,pbVar24,uVar57);
                if (iVar22 == -1) {
                  if (uVar18 == uVar60) {
                    iVar22 = dill_type_of(s,uVar60);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (99 < (int)uVar60) {
                        pvVar8 = s->p->vregs;
                        if ((pvVar8[(ulong)uVar60 - 100].use_info.use_count == 1) &&
                           (pvVar8[(ulong)uVar60 - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                          }
                          s->p->cur_ip = s->p->code_base + iVar16;
                        }
                      }
                      iVar22 = dill_type_of(s,uVar60);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f613;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar60);
                }
LAB_0010f613:
                if (iVar20 == -1) {
                  iVar20 = load_oprnd(s,1,local_40);
                }
                uVar18 = (uint)local_38;
                uVar57 = uVar18 & 0xf;
                uVar49 = (uint)local_c8;
                if ((local_38 & 0x10) != 0) {
                  if (iVar17 == -1) {
                    iVar17 = load_oprnd(s,2,(uint)local_c8);
                  }
                  info_ptr = (code *)(ulong)uVar57;
                  (*s->j->store)(s,uVar57,0,iVar17,iVar22,iVar20);
                  pvVar44 = extraout_RDX_19;
                  break;
                }
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,(uint)local_c8);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                (**(code **)((long)&s->j->load + (ulong)((uVar18 & 0x20) >> 2)))
                          (s,uVar57,0,iVar17,iVar22,iVar20);
LAB_0010f6a4:
                info_ptr = (code *)pbVar24;
                iVar22 = preg_of(s,pbVar24,uVar49);
                pvVar44 = extraout_RDX_17;
                uVar18 = 0xffffffff;
                if (iVar22 == -1) {
                  iVar16 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
                  info_ptr = (code *)(ulong)uVar49;
                  store_oprnd(s,uVar49,(int)extraout_RDX_17);
                  pvVar44 = extraout_RDX_18;
                  uVar18 = uVar49;
                }
                goto switchD_0010e1b2_default;
              case '\x06':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                lVar26 = (pvVar47->opnds).spec.param;
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,uVar57);
                bVar40 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  if (uVar18 == uVar57) {
                    iVar22 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar57) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar57 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar57 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar57);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f7c1;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar57);
                }
LAB_0010f7c1:
                uVar18 = bVar40 & 0xf;
                if ((bVar40 & 0x10) != 0) {
                  if (iVar17 == -1) {
                    iVar17 = load_oprnd(s,1,uVar49);
                  }
                  info_ptr = (code *)(ulong)uVar18;
                  (*s->j->storei)(s,uVar18,0,iVar17,iVar22,lVar26);
                  pvVar44 = extraout_RDX_22;
                  break;
                }
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                (**(code **)((long)&s->j->loadi + (ulong)((bVar40 & 0x20) >> 2)))
                          (s,uVar18,0,iVar17,iVar22,lVar26);
                goto LAB_0010f8fc;
              case '\a':
                uVar49 = (pvVar47->opnds).a3.dest;
                lVar26 = (pvVar47->opnds).spec.param;
                iVar22 = preg_of(s,pbVar24,uVar49);
                bVar40 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  pdVar33 = s->p;
                  iVar22 = dill_type_of(s,uVar49);
                  iVar22 = pdVar33->v_tmps[iVar22][0];
                }
                (*s->j->set)(s,bVar40 & 0xf,0,iVar22,lVar26);
                info_ptr = (code *)pbVar24;
                iVar22 = preg_of(s,pbVar24,uVar49);
                pvVar44 = extraout_RDX_04;
                goto joined_r0x0010ecbd;
              case '\b':
                uVar49 = (pvVar47->opnds).a3.dest;
                dVar2 = (pvVar47->opnds).sf.imm;
                iVar22 = preg_of(s,pbVar24,uVar49);
                bVar40 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  pdVar33 = s->p;
                  iVar22 = dill_type_of(s,uVar49);
                  iVar22 = pdVar33->v_tmps[iVar22][0];
                }
                (*s->j->setf)(s,bVar40 & 0xf,0,iVar22,dVar2);
                info_ptr = (code *)pbVar24;
                iVar22 = preg_of(s,pbVar24,uVar49);
                pvVar44 = extraout_RDX_08;
joined_r0x0010ecbd:
                uVar18 = 0xffffffff;
                if (iVar22 == -1) {
                  iVar16 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
                  info_ptr = (code *)(ulong)uVar49;
                  store_oprnd(s,uVar49,(int)pvVar44);
                  pvVar44 = extraout_RDX_09;
                  uVar18 = uVar49;
                }
                goto switchD_0010e1b2_default;
              case '\t':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,uVar57);
                bVar40 = pvVar47->insn_code;
                if (iVar22 == -1) {
                  if (uVar18 == uVar57) {
                    iVar22 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar57) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar57 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar57 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar57);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f41b;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar57);
                }
LAB_0010f41b:
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                (*s->j->mov)(s,bVar40 & 0xf,0,iVar17,iVar22);
                goto LAB_0010f773;
              case '\n':
                uVar18 = (byte)pvVar47->insn_code & 0xf;
                info_ptr = (code *)(ulong)uVar18;
                (*s->j->reti)(s,uVar18,0,(pvVar47->opnds).spec.param);
                pvVar44 = extraout_RDX_07;
                break;
              case '\v':
                cVar3 = pvVar47->insn_code;
                iVar22 = piVar30[1];
                if (iVar22 != -1) {
                  piVar36 = local_50;
                  do {
                    if (iVar22 == (pvVar47->opnds).a3.src2) {
                      iVar22 = piVar36[-2];
                      goto LAB_0010f135;
                    }
                    iVar22 = *piVar36;
                    piVar36 = piVar36 + 3;
                  } while (iVar22 != -1);
                }
                puts("New label not found");
                iVar22 = -1;
LAB_0010f135:
                uVar49 = (pvVar47->opnds).a3.dest;
                iVar17 = (pvVar47->opnds).a3.src1;
                iVar20 = preg_of(s,pbVar24,uVar49);
                iVar21 = preg_of(s,pbVar24,iVar17);
                if (iVar20 == -1) {
                  if (uVar18 == uVar49) {
                    iVar20 = dill_type_of(s,uVar49);
                    if (s->p->v_tmps[iVar20][0] != -1) {
                      if (((99 < (int)uVar49) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar49 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar49 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar20 = dill_type_of(s,uVar49);
                      iVar20 = s->p->v_tmps[iVar20][0];
                      goto LAB_0010f30d;
                    }
                  }
                  iVar20 = load_oprnd(s,0,uVar49);
                }
LAB_0010f30d:
                if (iVar21 == -1) {
                  iVar21 = load_oprnd(s,1,iVar17);
                }
                pjVar34 = s->j->b_data;
                uVar18 = (uint)pjVar34[cVar3].data1;
                info_ptr = (code *)(ulong)uVar18;
                (*s->j->jmp_b[cVar3])(s,uVar18,(int)pjVar34[cVar3].data2,iVar20,iVar21,iVar22);
                pvVar44 = extraout_RDX_13;
                break;
              case '\f':
                cVar3 = pvVar47->insn_code;
                iVar22 = piVar30[1];
                if (iVar22 != -1) {
                  piVar36 = local_50;
                  do {
                    if (iVar22 == (pvVar47->opnds).a3.src1) {
                      iVar22 = piVar36[-2];
                      goto LAB_0010f219;
                    }
                    iVar22 = *piVar36;
                    piVar36 = piVar36 + 3;
                  } while (iVar22 != -1);
                }
                puts("New label not found");
                iVar22 = -1;
LAB_0010f219:
                uVar49 = (pvVar47->opnds).a3.dest;
                lVar26 = (pvVar47->opnds).bri.imm_l;
                iVar17 = preg_of(s,pbVar24,uVar49);
                if (iVar17 == -1) {
                  if (uVar18 == uVar49) {
                    iVar17 = dill_type_of(s,uVar49);
                    if (s->p->v_tmps[iVar17][0] != -1) {
                      if (((99 < (int)uVar49) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar49 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar49 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar17 = dill_type_of(s,uVar49);
                      iVar17 = s->p->v_tmps[iVar17][0];
                      goto LAB_0010f3db;
                    }
                  }
                  iVar17 = load_oprnd(s,0,uVar49);
                }
LAB_0010f3db:
                pjVar34 = s->j->b_data;
                uVar18 = (uint)pjVar34[cVar3].data1;
                info_ptr = (code *)(ulong)uVar18;
                (*s->j->jmp_bi[cVar3])(s,uVar18,(int)pjVar34[cVar3].data2,iVar17,lVar26,iVar22);
                pvVar44 = extraout_RDX_14;
                goto LAB_0010f510;
              case '\r':
                iVar22 = piVar30[1];
                if (iVar22 != -1) {
                  piVar36 = local_50;
                  do {
                    if (iVar22 == (pvVar47->opnds).a3.src2) {
                      info_ptr = (code *)(long)piVar36[-2];
                      goto LAB_0010f2eb;
                    }
                    iVar22 = *piVar36;
                    piVar36 = piVar36 + 3;
                  } while (iVar22 != -1);
                }
                puts("New label not found");
                info_ptr = (code *)0xffffffffffffffff;
LAB_0010f2eb:
                (*s->j->jv)(s,(unsigned_long)info_ptr);
                pvVar44 = extraout_RDX_12;
                break;
              case '\x0e':
                p_Var9 = s->j->special;
                if (p_Var9 != (special_op)0x0) {
                  sVar5 = (pvVar47->opnds).spec.type;
                  info_ptr = (code *)(ulong)sVar5;
                  (*p_Var9)(s,sVar5,(pvVar47->opnds).spec.param);
                  pvVar44 = extraout_RDX_03;
                }
                goto switchD_0010e1b2_default;
              case '\x0f':
                uVar49 = (pvVar47->opnds).a3.dest;
                iVar22 = preg_of(s,pbVar24,uVar49);
                if (iVar22 == -1) {
                  if (uVar18 == uVar49) {
                    iVar22 = dill_type_of(s,uVar49);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar49) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar49 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar49 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar49);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f4d9;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar49);
                }
LAB_0010f4d9:
                info_ptr = (code *)(long)iVar22;
                (*s->j->jp)(s,(unsigned_long)info_ptr);
                pvVar44 = extraout_RDX_15;
LAB_0010f510:
                uVar18 = 0xffffffff;
                goto switchD_0010e1b2_default;
              case '\x10':
                info_ptr = (code *)(pvVar47->opnds).bri.imm_a;
                (*s->j->jpi)(s,info_ptr);
                pvVar44 = extraout_RDX_02;
                break;
              case '\x11':
                bVar40 = pvVar47->insn_code;
                uVar49 = (pvVar47->opnds).a3.dest;
                if ((short)uVar49 < 0) {
                  pushpop_inuse_regs(s,0,pvVar44);
                  iVar22 = -1;
                }
                else {
                  iVar22 = preg_of(s,pbVar24,uVar49);
                  if (iVar22 == -1) {
                    if (uVar18 == uVar49) {
                      iVar22 = dill_type_of(s,uVar49);
                      if (s->p->v_tmps[iVar22][0] != -1) {
                        if (((99 < (int)uVar49) &&
                            (pvVar8 = s->p->vregs,
                            pvVar8[(long)(int)uVar49 + -100].use_info.use_count == 1)) &&
                           (pvVar8[(long)(int)uVar49 + -100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                          }
                          s->p->cur_ip = s->p->code_base + iVar16;
                        }
                        iVar22 = dill_type_of(s,uVar49);
                        iVar22 = s->p->v_tmps[iVar22][0];
                        goto LAB_0010f95c;
                      }
                    }
                    iVar22 = load_oprnd(s,0,uVar49);
                  }
                }
LAB_0010f95c:
                uVar18 = bVar40 & 0xf;
                info_ptr = (code *)(ulong)uVar18;
                (*s->j->push)(s,uVar18,iVar22);
                pvVar44 = extraout_RDX_25;
                break;
              case '\x12':
                if ((pvVar47->insn_code & 0xfU) == 8) {
                  info_ptr = (code *)0x8;
                  (*s->j->pushpi)(s,8,(pvVar47->opnds).bri.imm_a);
                  pvVar44 = extraout_RDX_06;
                }
                else {
                  info_ptr = (code *)0x4;
                  (*s->j->pushi)(s,4,(pvVar47->opnds).spec.param);
                  pvVar44 = extraout_RDX_11;
                }
                break;
              case '\x13':
                uVar18 = (byte)pvVar47->insn_code & 0xf;
                info_ptr = (code *)(ulong)uVar18;
                (*s->j->pushfi)(s,uVar18,(pvVar47->opnds).sf.imm);
                pvVar44 = extraout_RDX_10;
                break;
              case '\x14':
                pbVar27 = (basic_block_conflict)((long)&local_e0->bblist[1].start + local_58);
                uVar49 = (pvVar47->opnds).a3.dest;
                bVar40 = pvVar47->insn_code;
                uVar57 = bVar40 & 0xf;
                iVar22 = 0;
                if (uVar57 != 0xb) {
                  iVar22 = preg_of(s,pbVar27,uVar49);
                }
                local_c8 = CONCAT44(local_c8._4_4_,iVar22);
                if ((bVar40 & 0x10) == 0) {
                  iVar22 = (*s->j->calli)(s,uVar57,(pvVar47->opnds).bri.imm_a,
                                          (pvVar47->opnds).calli.xfer_name);
                  pvVar44 = extraout_RDX_05;
                }
                else {
                  lVar26 = (pvVar47->opnds).bri.imm_l;
                  uVar60 = (uint)lVar26;
                  iVar22 = preg_of(s,pbVar24,uVar60);
                  if (iVar22 == -1) {
                    if (lVar26 == (int)uVar18) {
                      iVar22 = dill_type_of(s,uVar60);
                      if (s->p->v_tmps[iVar22][0] != -1) {
                        if (99 < (int)uVar60) {
                          pvVar8 = s->p->vregs;
                          if ((pvVar8[(ulong)(uVar60 & 0x7fffffff) - 100].use_info.use_count == 1)
                             && (pvVar8[(ulong)(uVar60 & 0x7fffffff) - 100].use_info.def_count == 1)
                             ) {
                            if (s->dill_debug != 0) {
                              puts(" -- Eliminating previous store -- ");
                            }
                            s->p->cur_ip = s->p->code_base + iVar16;
                          }
                        }
                        iVar22 = dill_type_of(s,uVar60);
                        iVar22 = s->p->v_tmps[iVar22][0];
                        goto LAB_0010f982;
                      }
                    }
                    iVar22 = load_oprnd(s,0,uVar60);
                  }
LAB_0010f982:
                  iVar22 = (*s->j->callr)(s,uVar57,iVar22);
                  pvVar44 = extraout_RDX_26;
                }
                if (uVar57 != 0xb) {
                  iVar17 = preg_of(s,pbVar27,uVar49);
                  if (iVar17 == -1) {
                    if ((int)uVar49 < 100) {
                      piVar36 = &s->p->c_param_args[(int)uVar49].offset;
                    }
                    else {
                      piVar36 = &s->p->vregs[(ulong)uVar49 - 100].offset;
                    }
                    iVar17 = *piVar36;
                    iVar20 = dill_type_of(s,uVar49);
                    if ((int)uVar49 < 100) {
                      iVar21 = s->dill_param_reg_pointer;
                    }
                    else {
                      iVar21 = s->dill_local_pointer;
                    }
                    (*s->j->storei)(s,iVar20,0,iVar22,iVar21,(long)iVar17);
                    pvVar44 = extraout_RDX_28;
                  }
                  else {
                    (*s->j->mov)(s,uVar57,0,(uint)local_c8,iVar22);
                    pvVar44 = extraout_RDX_27;
                  }
                }
                info_ptr = (code *)0x1;
                pushpop_inuse_regs(s,1,pvVar44);
                pvVar44 = extraout_RDX_29;
                break;
              case '\x15':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                lVar26 = (pvVar47->opnds).spec.param;
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,uVar57);
                if (iVar22 == -1) {
                  if (uVar18 == uVar57) {
                    iVar22 = dill_type_of(s,uVar57);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (((99 < (int)uVar57) &&
                          (pvVar8 = s->p->vregs,
                          pvVar8[(long)(int)uVar57 + -100].use_info.use_count == 1)) &&
                         (pvVar8[(long)(int)uVar57 + -100].use_info.def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                        }
                        s->p->cur_ip = s->p->code_base + iVar16;
                      }
                      iVar22 = dill_type_of(s,uVar57);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f730;
                    }
                  }
                  iVar22 = load_oprnd(s,0,uVar57);
                }
LAB_0010f730:
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                (*s->j->lea)(s,0,0,iVar17,iVar22,lVar26);
LAB_0010f773:
                info_ptr = (code *)pbVar24;
                iVar22 = preg_of(s,pbVar24,uVar49);
                pvVar44 = extraout_RDX_20;
                uVar18 = 0xffffffff;
                if (iVar22 == -1) {
                  iVar16 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
                  info_ptr = (code *)(ulong)uVar49;
                  store_oprnd(s,uVar49,(int)extraout_RDX_20);
                  pvVar44 = extraout_RDX_21;
                  uVar18 = uVar49;
                }
                goto switchD_0010e1b2_default;
              case '\x16':
                uVar49 = (pvVar47->opnds).a3.dest;
                uVar57 = (pvVar47->opnds).a3.src1;
                uVar60 = (pvVar47->opnds).a3.src2;
                local_c8 = (long)pvVar47->insn_code;
                vreg = uVar57;
                vreg_00 = uVar60;
                if ((uVar18 == uVar60) &&
                   ((uVar19 = (byte)pvVar47->insn_code - 4, 0x3d < uVar19 ||
                    (((0x7f0fe1fc3f800U >> ((ulong)uVar19 & 0x3f) & 1) == 0 &&
                     (vreg = uVar60, vreg_00 = uVar57,
                     (0x3f8000000000007fU >> ((ulong)uVar19 & 0x3f) & 1) == 0)))))) {
                  puts("Unknown opcode in is_compare_commutative");
                  vreg = uVar57;
                  vreg_00 = uVar60;
                }
                iVar17 = preg_of(s,pbVar24,uVar49);
                iVar22 = preg_of(s,pbVar24,vreg);
                iVar20 = preg_of(s,pbVar24,vreg_00);
                if (iVar22 == -1) {
                  if (uVar18 == vreg) {
                    iVar22 = dill_type_of(s,vreg);
                    if (s->p->v_tmps[iVar22][0] != -1) {
                      if (99 < (int)vreg) {
                        pvVar8 = s->p->vregs;
                        if ((pvVar8[(ulong)vreg - 100].use_info.use_count == 1) &&
                           (pvVar8[(ulong)vreg - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                          }
                          s->p->cur_ip = s->p->code_base + iVar16;
                        }
                      }
                      iVar22 = dill_type_of(s,vreg);
                      iVar22 = s->p->v_tmps[iVar22][0];
                      goto LAB_0010f87b;
                    }
                  }
                  iVar22 = load_oprnd(s,0,vreg);
                }
LAB_0010f87b:
                if (iVar20 == -1) {
                  iVar20 = load_oprnd(s,1,vreg_00);
                }
                if (iVar17 == -1) {
                  pdVar33 = s->p;
                  iVar17 = dill_type_of(s,uVar49);
                  iVar17 = pdVar33->v_tmps[iVar17][0];
                }
                pjVar34 = s->j->c_data;
                (*s->j->jmp_c[local_c8])
                          (s,(int)pjVar34[local_c8].data1,(int)pjVar34[local_c8].data2,iVar17,iVar22
                           ,iVar20);
LAB_0010f8fc:
                info_ptr = (code *)pbVar24;
                iVar22 = preg_of(s,pbVar24,uVar49);
                pvVar44 = extraout_RDX_23;
                uVar18 = 0xffffffff;
                if (iVar22 == -1) {
                  iVar16 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
                  info_ptr = (code *)(ulong)uVar49;
                  store_oprnd(s,uVar49,(int)extraout_RDX_23);
                  pvVar44 = extraout_RDX_24;
                  uVar18 = uVar49;
                }
              default:
                goto switchD_0010e1b2_default;
              }
              uVar18 = 0xffffffff;
switchD_0010e1b2_default:
              uVar59 = local_d8 + 1;
            } while (uVar59 <= (ulong)pbVar24->end);
          }
          foreach_bit(pbVar24->regs_defined,emit_putreg,pbVar24,s);
          uVar42 = local_70;
          if (count_verbose != 0) {
            uVar18 = (*s->j->count_insn)(s,(int)local_78,
                                         *(int *)&s->p->cur_ip - *(int *)&s->p->code_base);
            printf("Basic Block %zd, %d virtual instructions, %d physical instructions\n",uVar42,
                   (ulong)local_bc,(ulong)uVar18);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 < (ulong)(long)local_e0->bbcount);
        uVar59 = uVar59 * 0x28;
      }
      if (uVar59 == (uint)piVar30[(long)(int)uVar41 * 3]) {
        dill_mark_label(s,piVar30[(long)(int)uVar41 * 3 + 2]);
        uVar41 = uVar41 + 1;
      }
      if (piVar30[(long)(int)uVar41 * 3] != -1) {
        printf("Some labels (%d, old loc %d) not placed\n",(ulong)uVar41);
      }
    }
    free_bbs(local_e0);
    free(piVar30);
    iVar16 = local_44;
    if (local_44 == 0) {
      handle = dill_finalize(s);
      dill_free_handle(handle);
    }
    else {
      (*s->j->package_end)(s);
    }
    pdVar33 = s->p;
    s->j = (pdVar33->native).mach_jump;
    (pdVar33->native).mach_reset = pdVar33->mach_reset;
    (pdVar33->native).mach_info = pdVar33->mach_info;
    (pdVar33->native).code_base = pdVar33->code_base;
    pcVar23 = pdVar33->code_limit;
    (pdVar33->native).cur_ip = pdVar33->cur_ip;
    (pdVar33->native).code_limit = pcVar23;
    if (iVar16 == 0) {
      pdVar33->code_base = (char *)0x0;
    }
    pdVar33->mach_info = (void *)0x0;
  }
  else {
    free_bbs(pmVar58);
    pdVar33 = s->p;
  }
  pdVar33->mach_reset = dill_virtual_init;
LAB_0010db96:
  if (virtual_do_end::dill_verbose != 0) {
    dill_dump(s);
  }
  return;
}

Assistant:

static void
virtual_do_end(dill_stream s, int package)
{
    static int no_optimize = -1;
    static int dill_verbose = -1;
    static int old_reg_alloc = -1;
    static int do_emulation = -1;

    virtual_mach_info vmi = (virtual_mach_info)s->p->mach_info;
    void* insns = s->p->code_base;
    void* code_end = s->p->cur_ip;
    void* prefix_begin =
        (char*)insns + (vmi->prefix_code_start * sizeof(virtual_insn));
    ;
    label_translation_table ltable;
    int virtual_local_pointer = s->dill_local_pointer;

    if (dill_verbose == -1) {
        dill_verbose = (getenv("DILL_VERBOSE") != NULL);
        no_optimize = (getenv("DILL_NOOPTIMIZE") != NULL);
        old_reg_alloc = (getenv("DILL_OLD_REGS") != NULL);
        do_emulation = (getenv("DILL_DO_EMULATION") != NULL);
#ifdef EMULATION_ONLY
        do_emulation = 1;
#endif
    }
    s->p->virtual.code_base = s->p->code_base;
    if (vmi->prefix_code_start == -1)
        prefix_begin = code_end;
    build_bbs(s, insns, prefix_begin, code_end);

    if (!no_optimize) {
        if (count_verbose == -1) {
            count_verbose = (getenv("DILL_COUNTS") != NULL);
        }
        if (count_verbose == 1) {
            printf("Prior to optimization, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        const_propagation(s, insns, vmi);
        if (count_verbose == 1) {
            printf("After constant propagation, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        CSE_elimination(s, insns, vmi);
        if (count_verbose == 1) {
            printf(
                "After duplicate instruction elimination (CSE-lite), %d "
                "non-null virtual insns\n",
                virtual_insn_count(s));
        }
        reset_use_def_count(s, insns, vmi);
        kill_dead_regs(s, insns, vmi);
    }

    if (dill_verbose) {
        dump_bbs(s);
        s->dill_debug = 1;
    }
    s->p->virtual.mach_jump = s->j;
    s->p->virtual.mach_reset = s->p->mach_reset;
    s->p->virtual.mach_info = s->p->mach_info;
    s->p->virtual.code_base = s->p->code_base;
    s->p->virtual.cur_ip = s->p->cur_ip;
    s->p->virtual.code_limit = s->p->code_limit;

    if (do_emulation) {
#ifdef BUILD_EMULATOR
        /* do a return, just in case it's missing */
        if (vmi->prefix_code_start == -1) {
            dill_retii(s, 0);
            s->p->virtual.cur_ip = s->p->cur_ip;
	    s->p->virtual.code_base = s->p->code_base;
	    s->p->virtual.code_limit = s->p->code_limit;
        }
        setup_VM_proc(s);
#endif
        free_bbs(vmi);
        s->p->mach_reset = dill_virtual_init;
    } else if (dill_foreign_cg) {
        (dill_foreign_cg)(s, (virtual_insn*)s->p->code_base,
                          (virtual_insn*)s->p->cur_ip);
    } else {
        s->j = s->p->native.mach_jump;
        s->p->mach_reset = s->p->native.mach_reset;
        s->p->mach_info = s->p->native.mach_info;
        s->p->code_base = s->p->native.code_base;
        s->p->native.code_base = NULL;
        s->p->native.mach_info = NULL;
        if (s->p->code_base == NULL) {
            init_code_block(s);
            s->p->native.code_base = s->p->code_base;
            s->p->native.code_limit = s->p->code_limit;
        }
        s->p->cur_ip = s->p->code_base;
        s->p->code_limit = s->p->native.code_limit;

        s->p->native_mach_reset(s);
        ltable = build_label_translation(s);
        (s->j->proc_start)(s, "no name", s->p->c_param_count, vmi->arg_info,
                           (void*)0);
        fill_label_translation(s, ltable);
        if (old_reg_alloc) {
            do_register_assign(s, insns, code_end, virtual_local_pointer, vmi);
            emit_insns(s, insns, ltable, vmi);
        } else {
            new_emit_insns(s, insns, ltable, vmi);
        }
        free_bbs(vmi);
        free(ltable);
        if (package) {
            s->j->package_end(s);
        } else {
            dill_exec_handle h;
            h = dill_finalize(s);
            dill_free_handle(h);
        }
        s->j = s->p->native.mach_jump;
        s->p->native.mach_reset = s->p->mach_reset;
        s->p->native.mach_info = s->p->mach_info;
        s->p->native.code_base = s->p->code_base;
        s->p->native.cur_ip = s->p->cur_ip;
        s->p->native.code_limit = s->p->code_limit;
        if (!package)
            s->p->code_base = NULL;
        s->p->mach_info = NULL;
        s->p->mach_reset = dill_virtual_init;
    }
    if (dill_verbose) {
        dill_dump(s);
    }
}